

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QSize __thiscall QDockAreaLayoutInfo::sizeHint(QDockAreaLayoutInfo *this)

{
  QDockAreaLayoutItem *this_00;
  uint uVar1;
  Orientation OVar2;
  Representation RVar3;
  QDockAreaLayoutItem *pQVar4;
  bool bVar5;
  Representation RVar6;
  QSize QVar7;
  QSize QVar8;
  QSize QVar9;
  ulong uVar10;
  Representation RVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  QSize QVar15;
  uint local_78;
  uint local_74;
  QDockAreaLayoutItem *local_50;
  
  bVar5 = isEmpty(this);
  QVar8.wd.m_i = 0;
  QVar8.ht.m_i = 0;
  QVar7.wd.m_i = 0;
  QVar7.ht.m_i = 0;
  if (!bVar5) {
    lVar12 = 0;
    uVar13 = 0xffffff;
    uVar14 = 0;
    local_74 = 0;
    local_78 = 0;
    local_50 = (QDockAreaLayoutItem *)0x0;
    for (uVar10 = 0; uVar10 < (ulong)(this->item_list).d.size; uVar10 = uVar10 + 1) {
      pQVar4 = (this->item_list).d.ptr;
      this_00 = (QDockAreaLayoutItem *)((long)&pQVar4->widgetItem + lVar12);
      bVar5 = QDockAreaLayoutItem::skip(this_00);
      RVar11.m_i = local_74;
      if (!bVar5) {
        uVar1 = *(uint *)((long)&pQVar4->flags + lVar12);
        QVar7 = QDockAreaLayoutItem::sizeHint(this_00);
        OVar2 = this->o;
        QVar8 = QDockAreaLayoutItem::minimumSize(this_00);
        RVar11 = QVar8.ht.m_i;
        if (OVar2 == Vertical) {
          RVar11 = QVar8.wd.m_i;
        }
        if (RVar11.m_i < (int)uVar14) {
          RVar11.m_i = uVar14;
        }
        uVar14 = RVar11.m_i;
        OVar2 = this->o;
        QVar9 = QDockAreaLayoutItem::maximumSize(this_00);
        QVar8 = (QSize)((ulong)QVar9 >> 0x20);
        if (OVar2 == Vertical) {
          QVar8 = QVar9;
        }
        RVar11.m_i = QVar8.wd.m_i.m_i;
        if ((int)uVar13 < QVar8.wd.m_i.m_i) {
          RVar11.m_i = uVar13;
        }
        uVar13 = RVar11.m_i;
        RVar11 = QVar7.ht.m_i;
        RVar3 = QVar7.wd.m_i;
        if (this->tabbed == true) {
          if ((uVar1 & 1) == 0) {
            RVar6.m_i = RVar11.m_i;
            if (this->o == Horizontal) {
              RVar6.m_i = RVar3.m_i;
            }
          }
          else {
            RVar6.m_i = *(uint *)((long)&pQVar4->size + lVar12);
          }
          if (RVar6.m_i < (int)local_78) {
            RVar6.m_i = local_78;
          }
        }
        else {
          if ((local_50 == (QDockAreaLayoutItem *)0x0) || ((uVar1 & 1) != 0)) {
            if ((uVar1 & 1) == 0) goto LAB_003c7f26;
            RVar6.m_i = *(uint *)((long)&pQVar4->size + lVar12);
          }
          else {
            if (((local_50->flags & 1) == 0) &&
               (bVar5 = QDockAreaLayoutItem::hasFixedSize(local_50,this->o), !bVar5)) {
              local_78 = local_78 + *this->sep;
            }
LAB_003c7f26:
            RVar6.m_i = RVar11.m_i;
            if (this->o == Horizontal) {
              RVar6.m_i = RVar3.m_i;
            }
          }
          RVar6.m_i = local_78 + RVar6.m_i;
        }
        local_78 = RVar6.m_i;
        if (this->o == Vertical) {
          RVar11.m_i = RVar3.m_i;
        }
        local_50 = this_00;
        if (RVar11.m_i < (int)local_74) {
          RVar11.m_i = local_74;
        }
      }
      local_74 = RVar11.m_i;
      lVar12 = lVar12 + 0x28;
    }
    if ((int)uVar13 <= (int)uVar14) {
      uVar13 = uVar14;
    }
    if ((int)uVar14 < (int)local_74) {
      uVar14 = local_74;
    }
    if ((int)uVar13 <= (int)uVar14) {
      uVar14 = uVar13;
    }
    QVar15.ht.m_i = 0;
    QVar15.wd.m_i = uVar14;
    QVar9 = QVar15;
    if (this->o == Horizontal) {
      QVar7.ht.m_i = 0;
      QVar7.wd.m_i = local_78;
    }
    else if (this->o == Vertical) {
      QVar9.ht.m_i = 0;
      QVar9.wd.m_i = local_78;
      QVar7 = QVar15;
    }
    else {
      QVar7.wd.m_i = -1;
      QVar7.ht.m_i = -1;
    }
    QVar8 = QVar9;
    if (this->tabbed != false) {
      QVar15 = tabBarSizeHint(this);
      if ((uint)this->tabBarShape < 8) {
        if ((0x33U >> (this->tabBarShape & 0x1fU) & 1) == 0) {
          QVar8 = (QSize)((ulong)QVar15 >> 0x20);
          if (QVar15.ht.m_i.m_i < QVar9.wd.m_i.m_i) {
            QVar8 = QVar9;
          }
          QVar7.wd.m_i = QVar7.wd.m_i.m_i + QVar15.wd.m_i.m_i;
          QVar7.ht.m_i = 0;
        }
        else {
          QVar8.wd.m_i = QVar9.wd.m_i.m_i + QVar15.ht.m_i.m_i;
          QVar8.ht.m_i = 0;
          if (QVar7.wd.m_i.m_i <= QVar15.wd.m_i.m_i) {
            QVar7 = QVar15;
          }
          QVar7 = (QSize)((ulong)QVar7 & 0xffffffff);
        }
      }
    }
  }
  return (QSize)((ulong)QVar7 & 0xffffffff | (long)QVar8 << 0x20);
}

Assistant:

QSize QDockAreaLayoutInfo::sizeHint() const
{
    if (isEmpty())
        return QSize(0, 0);

    int a = 0, b = 0;
    int min_perp = 0;
    int max_perp = QWIDGETSIZE_MAX;
    const QDockAreaLayoutItem *previous = nullptr;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        bool gap = item.flags & QDockAreaLayoutItem::GapItem;

        QSize size_hint = item.sizeHint();
        min_perp = qMax(min_perp, perp(o, item.minimumSize()));
        max_perp = qMin(max_perp, perp(o, item.maximumSize()));

#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMax(a, gap ? item.size : pick(o, size_hint));
        } else
#endif
        {
            if (previous && !gap && !(previous->flags &  QDockAreaLayoutItem::GapItem)
                && !previous->hasFixedSize(o)) {
                a += *sep;
            }
            a += gap ? item.size : pick(o, size_hint);
        }
        b = qMax(b, perp(o, size_hint));

        previous = &item;
    }

    max_perp = qMax(max_perp, min_perp);
    b = qMax(b, min_perp);
    b = qMin(b, max_perp);

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        QSize tbh = tabBarSizeHint();
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularNorth:
            case QTabBar::TriangularSouth:
                result.rheight() += tbh.height();
                result.rwidth() = qMax(tbh.width(), result.width());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
            case QTabBar::TriangularEast:
            case QTabBar::TriangularWest:
                result.rheight() = qMax(tbh.height(), result.height());
                result.rwidth() += tbh.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}